

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

void __thiscall calculator::ExpressionParser<__int128>::unexpected(ExpressionParser<__int128> *this)

{
  ostream *poVar1;
  string *message;
  undefined8 uVar2;
  error *in_RDI;
  ostringstream msg;
  string *expr;
  string local_1b0 [48];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,"Syntax error: unexpected token \"");
  expr = (string *)(in_RDI->expr_).field_2._M_allocated_capacity;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_1b0,(ulong)in_RDI);
  message = (string *)std::operator<<(poVar1,local_1b0);
  poVar1 = std::operator<<((ostream *)message,"\" at index ");
  std::ostream::operator<<(poVar1,(in_RDI->expr_).field_2._M_allocated_capacity);
  std::__cxx11::string::~string(local_1b0);
  uVar2 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  error::error(in_RDI,expr,message);
  __cxa_throw(uVar2,&error::typeinfo,error::~error);
}

Assistant:

void unexpected() const
  {
    std::ostringstream msg;
    msg << "Syntax error: unexpected token \""
        << expr_.substr(index_, expr_.size() - index_)
        << "\" at index "
        << index_;
    throw calculator::error(expr_, msg.str());
  }